

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

void __thiscall
cmExportCommand::StorePackageRegistryDir
          (cmExportCommand *this,string *package,char *content,char *hash)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  string fname;
  ostringstream e;
  cmGeneratedFileStream entry;
  string local_428;
  string local_408;
  undefined1 local_3e8 [376];
  undefined1 local_270 [584];
  
  local_428._M_string_length = 0;
  local_428.field_2._M_local_buf[0] = '\0';
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  bVar1 = cmsys::SystemTools::GetEnv("HOME",&local_428);
  if (bVar1) {
    cmsys::SystemTools::ConvertToUnixSlashes(&local_428);
    std::__cxx11::string::append((char *)&local_428);
    std::__cxx11::string::_M_append((char *)&local_428,(ulong)(package->_M_dataplus)._M_p);
    cmsys::SystemTools::MakeDirectory(&local_428,(mode_t *)0x0);
    std::__cxx11::string::append((char *)&local_428);
    std::__cxx11::string::append((char *)&local_428);
    bVar1 = cmsys::SystemTools::FileExists(&local_428);
    if (!bVar1) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_270,&local_428,true,None);
      if ((*(uint *)(*(_func_int **)(local_270._0_8_ + -0x18) + (long)(local_270 + 0x20)) & 5) == 0)
      {
        if (content == (char *)0x0) {
          std::ios::clear((int)&local_428 + (int)*(_func_int **)(local_270._0_8_ + -0x18) + 0x1b8);
        }
        else {
          sVar3 = strlen(content);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,content,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"\n",1);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3e8,"Cannot create package registry file:\n",0x25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"  ",2);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3e8,local_428._M_dataplus._M_p,
                            local_428._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_408._M_dataplus._M_p,local_408._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
        std::ios_base::~ios_base((ios_base *)(local_3e8 + 0x70));
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExportCommand::StorePackageRegistryDir(std::string const& package,
                                              const char* content,
                                              const char* hash)
{
#  if defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) !=
      B_OK) {
    return;
  }
  std::string fname = dir;
  fname += "/cmake/packages/";
  fname += package;
#  else
  std::string fname;
  if (!cmSystemTools::GetEnv("HOME", fname)) {
    return;
  }
  cmSystemTools::ConvertToUnixSlashes(fname);
  fname += "/.cmake/packages/";
  fname += package;
#  endif
  cmSystemTools::MakeDirectory(fname);
  fname += "/";
  fname += hash;
  if (!cmSystemTools::FileExists(fname)) {
    cmGeneratedFileStream entry(fname, true);
    if (entry) {
      entry << content << "\n";
    } else {
      std::ostringstream e;
      /* clang-format off */
      e << "Cannot create package registry file:\n"
        << "  " << fname << "\n"
        << cmSystemTools::GetLastSystemError() << "\n";
      /* clang-format on */
      this->Makefile->IssueMessage(MessageType::WARNING, e.str());
    }
  }
}